

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O0

BOOL check_posix_syntax(PCRE2_SPTR8 ptr,PCRE2_SPTR8 ptrend,PCRE2_SPTR8 *endptr)

{
  PCRE2_UCHAR8 terminator;
  PCRE2_SPTR8 *endptr_local;
  PCRE2_SPTR8 ptrend_local;
  PCRE2_SPTR8 ptr_local;
  
  ptrend_local = ptr + 1;
  do {
    if ((long)ptrend - (long)ptrend_local < 2) {
      return 0;
    }
    if ((*ptrend_local == '\\') && ((ptrend_local[1] == ']' || (ptrend_local[1] == '\\')))) {
      ptrend_local = ptrend_local + 1;
    }
    else {
      if (((*ptrend_local == '[') && (ptrend_local[1] == *ptr)) || (*ptrend_local == ']')) {
        return 0;
      }
      if ((*ptrend_local == *ptr) && (ptrend_local[1] == ']')) {
        *endptr = ptrend_local;
        return 1;
      }
    }
    ptrend_local = ptrend_local + 1;
  } while( true );
}

Assistant:

static BOOL
check_posix_syntax(PCRE2_SPTR ptr, PCRE2_SPTR ptrend, PCRE2_SPTR *endptr)
{
PCRE2_UCHAR terminator;  /* Don't combine these lines; the Solaris cc */
terminator = *ptr++;     /* compiler warns about "non-constant" initializer. */

for (; ptrend - ptr >= 2; ptr++)
  {
  if (*ptr == CHAR_BACKSLASH &&
      (ptr[1] == CHAR_RIGHT_SQUARE_BRACKET || ptr[1] == CHAR_BACKSLASH))
    ptr++;

  else if ((*ptr == CHAR_LEFT_SQUARE_BRACKET && ptr[1] == terminator) ||
            *ptr == CHAR_RIGHT_SQUARE_BRACKET) return FALSE;

  else if (*ptr == terminator && ptr[1] == CHAR_RIGHT_SQUARE_BRACKET)
    {
    *endptr = ptr;
    return TRUE;
    }
  }

return FALSE;
}